

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test::testBody
          (TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  cpputest_longlong cVar6;
  SimpleString paramName;
  SimpleString local_80;
  MockNamedValue local_70;
  
  SimpleString::SimpleString(&local_80,"paramName");
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0xf])(pMVar1,&local_80,0x309);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_70,pMVar1,&local_80);
  pcVar4 = SimpleString::asCharString((SimpleString *)&local_70);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"long long int",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xfd,pTVar5);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_70,pMVar1,&local_80);
  cVar6 = MockNamedValue::getLongLongIntValue(&local_70);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x10])
            (pUVar3,0x309,cVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xfe,pTVar5);
  MockNamedValue::~MockNamedValue(&local_70);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,&local_80);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 0xff),"CHECK","call->hasInputParameterWithName(paramName)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xff,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_70);
  pcVar4 = SimpleString::asCharString((SimpleString *)&local_70);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"funcName -> long long int paramName: <777 (0x309)>",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x100);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithLongLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    long long value = 777;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("long long int", call->getInputParameterType(paramName).asCharString());
    LONGLONGS_EQUAL(value, call->getInputParameter(paramName).getLongLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> long long int paramName: <777 (0x309)>", call->callToString().asCharString());
}